

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_update_local_settings
              (nghttp2_session *session,nghttp2_settings_entry *iv,size_t niv)

{
  bool bVar1;
  uint32_t local_50;
  uint local_44;
  uint32_t uStack_40;
  uint8_t header_table_size_seen;
  uint32_t min_header_table_size;
  uint32_t header_table_size;
  int32_t new_initial_window_size;
  size_t i;
  int rv;
  size_t niv_local;
  nghttp2_settings_entry *iv_local;
  nghttp2_session *session_local;
  
  min_header_table_size = 0xffffffff;
  uStack_40 = 0;
  local_44 = 0xffffffff;
  bVar1 = false;
  for (_header_table_size = 0; _header_table_size < niv; _header_table_size = _header_table_size + 1
      ) {
    if (iv[_header_table_size].settings_id == 1) {
      bVar1 = true;
      uStack_40 = iv[_header_table_size].value;
      if (local_44 < iv[_header_table_size].value) {
        local_50 = local_44;
      }
      else {
        local_50 = iv[_header_table_size].value;
      }
      local_44 = local_50;
    }
    else if (iv[_header_table_size].settings_id == 4) {
      min_header_table_size = iv[_header_table_size].value;
    }
  }
  if (((!bVar1) ||
      (((uStack_40 <= local_44 ||
        (session_local._4_4_ =
              nghttp2_hd_inflate_change_table_size(&session->hd_inflater,(ulong)local_44),
        session_local._4_4_ == 0)) &&
       (session_local._4_4_ =
             nghttp2_hd_inflate_change_table_size(&session->hd_inflater,(ulong)uStack_40),
       session_local._4_4_ == 0)))) &&
     ((min_header_table_size == 0xffffffff ||
      (session_local._4_4_ =
            session_update_local_initial_window_size
                      (session,min_header_table_size,(session->local_settings).initial_window_size),
      session_local._4_4_ == 0)))) {
    for (_header_table_size = 0; _header_table_size < niv;
        _header_table_size = _header_table_size + 1) {
      switch(iv[_header_table_size].settings_id) {
      case 1:
        (session->local_settings).header_table_size = iv[_header_table_size].value;
        break;
      case 2:
        (session->local_settings).enable_push = iv[_header_table_size].value;
        break;
      case 3:
        (session->local_settings).max_concurrent_streams = iv[_header_table_size].value;
        break;
      case 4:
        (session->local_settings).initial_window_size = iv[_header_table_size].value;
        break;
      case 5:
        (session->local_settings).max_frame_size = iv[_header_table_size].value;
        break;
      case 6:
        (session->local_settings).max_header_list_size = iv[_header_table_size].value;
        break;
      case 8:
        (session->local_settings).enable_connect_protocol = iv[_header_table_size].value;
        break;
      case 9:
        (session->local_settings).no_rfc7540_priorities = iv[_header_table_size].value;
      }
    }
    session_local._4_4_ = 0;
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_update_local_settings(nghttp2_session *session,
                                          nghttp2_settings_entry *iv,
                                          size_t niv) {
  int rv;
  size_t i;
  int32_t new_initial_window_size = -1;
  uint32_t header_table_size = 0;
  uint32_t min_header_table_size = UINT32_MAX;
  uint8_t header_table_size_seen = 0;
  /* For NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE, use the value last
     seen.  For NGHTTP2_SETTINGS_HEADER_TABLE_SIZE, use both minimum
     value and last seen value. */
  for (i = 0; i < niv; ++i) {
    switch (iv[i].settings_id) {
    case NGHTTP2_SETTINGS_HEADER_TABLE_SIZE:
      header_table_size_seen = 1;
      header_table_size = iv[i].value;
      min_header_table_size = nghttp2_min(min_header_table_size, iv[i].value);
      break;
    case NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE:
      new_initial_window_size = (int32_t)iv[i].value;
      break;
    }
  }
  if (header_table_size_seen) {
    if (min_header_table_size < header_table_size) {
      rv = nghttp2_hd_inflate_change_table_size(&session->hd_inflater,
                                                min_header_table_size);
      if (rv != 0) {
        return rv;
      }
    }

    rv = nghttp2_hd_inflate_change_table_size(&session->hd_inflater,
                                              header_table_size);
    if (rv != 0) {
      return rv;
    }
  }
  if (new_initial_window_size != -1) {
    rv = session_update_local_initial_window_size(
        session, new_initial_window_size,
        (int32_t)session->local_settings.initial_window_size);
    if (rv != 0) {
      return rv;
    }
  }

  for (i = 0; i < niv; ++i) {
    switch (iv[i].settings_id) {
    case NGHTTP2_SETTINGS_HEADER_TABLE_SIZE:
      session->local_settings.header_table_size = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_ENABLE_PUSH:
      session->local_settings.enable_push = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS:
      session->local_settings.max_concurrent_streams = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE:
      session->local_settings.initial_window_size = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_MAX_FRAME_SIZE:
      session->local_settings.max_frame_size = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_MAX_HEADER_LIST_SIZE:
      session->local_settings.max_header_list_size = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_ENABLE_CONNECT_PROTOCOL:
      session->local_settings.enable_connect_protocol = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_NO_RFC7540_PRIORITIES:
      session->local_settings.no_rfc7540_priorities = iv[i].value;
      break;
    }
  }

  return 0;
}